

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int rawWaveAddGeneric(uint numIn1,rawWave_t *in1)

{
  rawWave_t *prVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint local_6c;
  uint32_t *local_68;
  
  uVar8 = (ulong)(uint)wfcur;
  uVar7 = wfc[uVar8];
  lVar12 = uVar8 * 0x2ee00;
  lVar9 = (ulong)(1 - wfcur) * 0x2ee00;
  uVar14 = 0;
  uVar20 = -(uint)(numIn1 == 0);
  uVar16 = -(uint)(uVar7 == 0);
  local_68 = &wf[1 - wfcur][0].flags;
  uVar15 = 0x416c;
  uVar19 = 0;
  local_6c = 0;
  uVar17 = 0;
  uVar13 = 0;
  while ((uVar10 = (uint)uVar14, local_6c < uVar7 || uVar13 < numIn1 && (uVar14 < 12000))) {
    uVar18 = uVar17;
    if (uVar20 < uVar16) {
      if (uVar17 <= uVar20 && uVar20 - uVar17 != 0) {
        piVar2 = (int *)(lVar9 + 0x131888 + (ulong)(uVar10 - 1) * 0x10);
        *piVar2 = *piVar2 + (uVar20 - uVar17);
        uVar18 = uVar20;
      }
      uVar5 = in1[uVar13].gpioOff;
      ((rawWave_t *)(local_68 + -3))->gpioOn = in1[uVar13].gpioOn;
      ((rawWave_t *)(local_68 + -3))->gpioOff = uVar5;
      *local_68 = in1[uVar13].flags;
      uVar20 = in1[uVar13].usDelay + uVar18;
      uVar13 = uVar13 + 1;
    }
    else {
      uVar11 = (ulong)local_6c;
      if (uVar16 < uVar20) {
        if (uVar17 <= uVar16 && uVar16 - uVar17 != 0) {
          piVar2 = (int *)(lVar9 + 0x131888 + (ulong)(uVar10 - 1) * 0x10);
          *piVar2 = *piVar2 + (uVar16 - uVar17);
          uVar18 = uVar16;
        }
        prVar1 = wf[uVar8] + uVar11;
        uVar5 = prVar1->gpioOff;
        ((rawWave_t *)(local_68 + -3))->gpioOn = prVar1->gpioOn;
        ((rawWave_t *)(local_68 + -3))->gpioOff = uVar5;
        *local_68 = *(uint *)(lVar12 + 0x13188c + uVar11 * 0x10);
        iVar6 = *(int *)(lVar12 + 0x131888 + uVar11 * 0x10);
      }
      else {
        if (uVar17 <= uVar20 && uVar20 - uVar17 != 0) {
          piVar2 = (int *)(lVar9 + 0x131888 + (ulong)(uVar10 - 1) * 0x10);
          *piVar2 = *piVar2 + (uVar20 - uVar17);
          uVar18 = uVar20;
        }
        prVar1 = wf[uVar8] + uVar11;
        uVar3._0_4_ = prVar1->gpioOn;
        uVar3._4_4_ = prVar1->gpioOff;
        uVar4._0_4_ = in1[uVar13].gpioOn;
        uVar4._4_4_ = in1[uVar13].gpioOff;
        ((rawWave_t *)(local_68 + -3))->gpioOn = (int)(uVar3 | uVar4);
        ((rawWave_t *)(local_68 + -3))->gpioOff = (int)((uVar3 | uVar4) >> 0x20);
        *local_68 = *(uint *)(lVar12 + 0x13188c + uVar11 * 0x10) | in1[uVar13].flags;
        uVar20 = in1[uVar13].usDelay + uVar18;
        uVar13 = uVar13 + 1;
        iVar6 = *(int *)(lVar12 + 0x131888 + uVar11 * 0x10);
      }
      uVar16 = iVar6 + uVar18;
      local_6c = local_6c + 1;
    }
    uVar17 = uVar16;
    if (uVar20 < uVar16) {
      uVar17 = uVar20;
    }
    local_68[-1] = uVar17 - uVar18;
    iVar6 = waveDelayCBs(uVar17 - uVar18);
    uVar10 = *local_68 & 1;
    uVar18 = *local_68 & 2;
    uVar15 = (uVar15 - uVar10) + ((int)(uVar18 << 0x1e) >> 0x1f);
    uVar19 = (uVar18 >> 1) + uVar10 +
             ((((iVar6 + uVar19) - (uint)(((rawWave_t *)(local_68 + -3))->gpioOn == 0)) + 2) -
             (uint)(local_68[-2] == 0));
    uVar14 = uVar14 + 1;
    if (numIn1 <= uVar13) {
      uVar20 = 0xffffffff;
    }
    if (uVar7 <= local_6c) {
      uVar16 = 0xffffffff;
    }
    local_68 = local_68 + 4;
  }
  uVar7 = 0xffffffdc;
  if ((uVar14 < 12000) && (uVar10 < uVar15)) {
    if (wfStats_1 < uVar17) {
      wfStats_1 = uVar17;
    }
    if (wfStats_4 < uVar10) {
      wfStats_4 = uVar10;
    }
    if (wfStats_7 < uVar19) {
      wfStats_7 = uVar19;
    }
    wfcur = 1 - wfcur;
    wfStats_0 = uVar17;
    wfStats_3 = uVar10;
    wfStats_6 = uVar19;
    *(uint *)((long)wfc + (ulong)(uint)(wfcur * 4)) = uVar10;
    uVar7 = uVar10;
  }
  return uVar7;
}

Assistant:

int rawWaveAddGeneric(unsigned numIn1, rawWave_t *in1)
{
   unsigned inPos1=0, inPos2=0, outPos=0, level = NUM_WAVE_OOL;

   unsigned cbs=0;

   unsigned numIn2, numOut;

   uint32_t tNow, tNext1, tNext2, tDelay;

   rawWave_t *in2, *out;

   numIn2 = wfc[wfcur];
   in2    = wf[wfcur];

   numOut = PI_WAVE_MAX_PULSES;
   out   = wf[1-wfcur];

   tNow = 0;

   if (!numIn1) tNext1 = -1; else tNext1 = 0;
   if (!numIn2) tNext2 = -1; else tNext2 = 0;

   while (((inPos1<numIn1) || (inPos2<numIn2)) && (outPos<numOut))
   {
      if (tNext1 < tNext2)
      {
         /* pulse 1 due */

         if (tNow < tNext1)
         {
            /* extend previous delay */
            out[outPos-1].usDelay += (tNext1 - tNow);
            tNow = tNext1;
         }

         out[outPos].gpioOn  = in1[inPos1].gpioOn;
         out[outPos].gpioOff = in1[inPos1].gpioOff;
         out[outPos].flags   = in1[inPos1].flags;

         tNext1 = tNow + in1[inPos1].usDelay; ++inPos1;
      }
      else if (tNext2 < tNext1)
      {
         /* pulse 2 due */

         if (tNow < tNext2)
         {
            /* extend previous delay */
            out[outPos-1].usDelay += (tNext2 - tNow);
            tNow = tNext2;
         }

         out[outPos].gpioOn  = in2[inPos2].gpioOn;
         out[outPos].gpioOff = in2[inPos2].gpioOff;
         out[outPos].flags   = in2[inPos2].flags;

         tNext2 = tNow + in2[inPos2].usDelay; ++inPos2;
      }
      else
      {
         /* pulse 1 and 2 both due */

         if (tNow < tNext1)
         {
            /* extend previous delay */
            out[outPos-1].usDelay += (tNext1 - tNow);
            tNow = tNext1;
         }

         out[outPos].gpioOn  = in1[inPos1].gpioOn  | in2[inPos2].gpioOn;
         out[outPos].gpioOff = in1[inPos1].gpioOff | in2[inPos2].gpioOff;
         out[outPos].flags   = in1[inPos1].flags   | in2[inPos2].flags;

         tNext1 = tNow + in1[inPos1].usDelay; ++inPos1;
         tNext2 = tNow + in2[inPos2].usDelay; ++inPos2;
      }

      if (tNext1 <= tNext2) { tDelay = tNext1 - tNow; tNow = tNext1; }
      else                  { tDelay = tNext2 - tNow; tNow = tNext2; }

      out[outPos].usDelay = tDelay;

      cbs += waveDelayCBs(tDelay);

      if (out[outPos].gpioOn) cbs++; /* one cb if gpio on */

      if (out[outPos].gpioOff) cbs++; /* one cb if gpio off */

      if (out[outPos].flags & WAVE_FLAG_READ)
      {
         cbs++; /* one cb if read */
         --level;
      }

      if (out[outPos].flags & WAVE_FLAG_TICK)
      {
         cbs++; /* one cb if tick */
         --level;
      }

      outPos++;

      if (inPos1 >= numIn1) tNext1 = -1;
      if (inPos2 >= numIn2) tNext2 = -1;

   }

   if ((outPos < numOut) && (outPos < level))
   {
      wfStats.micros = tNow;

      if (tNow > wfStats.highMicros) wfStats.highMicros = tNow;

      wfStats.pulses = outPos;

      if (outPos > wfStats.highPulses) wfStats.highPulses = outPos;

      wfStats.cbs    = cbs;

      if (cbs > wfStats.highCbs) wfStats.highCbs = cbs;

      wfc[1-wfcur] = outPos;
      wfcur = 1 - wfcur;

      return outPos;
   }
   else return PI_TOO_MANY_PULSES;
}